

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

_Bool Curl_ssl_conn_config_match(Curl_easy *data,connectdata *candidate,_Bool proxy)

{
  _Bool proxy_local;
  connectdata *candidate_local;
  Curl_easy *data_local;
  
  if (proxy) {
    data_local._7_1_ =
         match_ssl_primary_config(data,&(data->set).proxy_ssl.primary,&candidate->proxy_ssl_config);
  }
  else {
    data_local._7_1_ =
         match_ssl_primary_config(data,&(data->set).ssl.primary,&candidate->ssl_config);
  }
  return data_local._7_1_;
}

Assistant:

bool Curl_ssl_conn_config_match(struct Curl_easy *data,
                                struct connectdata *candidate,
                                bool proxy)
{
#ifndef CURL_DISABLE_PROXY
  if(proxy)
    return match_ssl_primary_config(data, &data->set.proxy_ssl.primary,
                                    &candidate->proxy_ssl_config);
#else
  (void)proxy;
#endif
  return match_ssl_primary_config(data, &data->set.ssl.primary,
                                  &candidate->ssl_config);
}